

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

int adios2::utils::readVarBlock<std::__cxx11::string>
              (Engine *fp,IO *io,
              Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *variable,size_t step,size_t blockid,Dims *Count,Dims *Start)

{
  undefined1 auVar1 [16];
  bool bVar2;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *ppVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 uVar6;
  unsigned_long *puVar7;
  pointer in_RCX;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_RDX;
  Variable *in_RDI;
  undefined8 in_R8;
  VariableBase *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  Dims countv;
  Dims startv;
  uint64_t tmpprod;
  uint64_t startoffset;
  int out_of_bound;
  int ndim;
  int nsteps;
  size_t elemsize;
  int ndigits_dims [32];
  bool incdim;
  uint64_t readn [16];
  uint64_t actualreadn;
  uint64_t maxreadn;
  uint64_t sum;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataV;
  uint64_t ct;
  uint64_t st;
  int tidx;
  uint64_t nelems;
  uint64_t c [16];
  uint64_t s [16];
  uint64_t count_t [16];
  uint64_t start_t [16];
  int j;
  int i;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffb30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb40;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *__x;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *this;
  Dims *in_stack_fffffffffffffb60;
  pointer in_stack_fffffffffffffb68;
  uint64_t *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  int iVar8;
  int local_46c;
  pair<unsigned_long,_unsigned_long> local_468 [4];
  undefined1 local_428 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_410;
  ulong local_3f8;
  long local_3f0;
  int local_3d0;
  undefined4 local_3cc;
  int local_3c8;
  int local_3b4;
  pointer local_3b0;
  int *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc64;
  uint64_t *in_stack_fffffffffffffc68;
  uint64_t *in_stack_fffffffffffffc70;
  DataType in_stack_fffffffffffffc7c;
  void *in_stack_fffffffffffffc80;
  ulong auStack_318 [16];
  long local_298;
  ulong local_290;
  ulong local_288;
  undefined1 local_280 [24];
  Dims *local_268;
  pointer local_260;
  int local_254;
  ulong local_250;
  ulong local_248 [16];
  long local_1c8 [16];
  ulong local_148 [16];
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c8 [2];
  uint local_40;
  uint local_3c;
  undefined8 local_30;
  pointer local_28;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *local_20;
  Variable *local_10;
  int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16b126);
  local_3b0 = local_20[1].first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
  if ((timestep & 1) == 0) {
    in_stack_fffffffffffffb70 = (uint64_t *)adios2::core::VariableBase::GetAvailableStepsCount();
    iVar8 = (int)in_stack_fffffffffffffb70;
  }
  else {
    iVar8 = 1;
  }
  local_3b4 = iVar8;
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &local_20[2].second.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_3c8 = (int)sVar4;
  local_250 = 1;
  local_254 = 0;
  if (1 < local_3b4) {
    if ((long)istart < 0) {
      local_260 = (pointer)((long)local_3b4 + (long)istart);
    }
    else {
      local_260 = istart;
    }
    if ((long)icount < 0) {
      local_268 = (Dims *)((long)icount + (((long)local_3b4 + 1) - (long)local_260));
    }
    else {
      local_268 = icount;
    }
    if (2 < verbose) {
      printf("    time: st=%lu ct=%lu\n",local_260,local_268);
    }
    if ((local_28 < local_260) || ((pointer)((long)local_260 + (long)local_268) <= local_28))
    goto LAB_0016c0e4;
    local_254 = 1;
  }
  local_3d0 = 0;
  for (local_40 = 0; (int)local_40 < local_3c8; local_40 = local_40 + 1) {
    if ((long)(&istart)[(int)(local_40 + local_254)] < 0) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_R9,
                          (long)(int)local_40);
      local_260 = (pointer)(*pvVar5 + (long)(&istart)[(int)(local_40 + local_254)]);
    }
    else {
      local_260 = (&istart)[(int)(local_40 + local_254)];
    }
    if ((long)(&icount)[(int)(local_40 + local_254)] < 0) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_R9,
                          (long)(int)local_40);
      local_268 = (Dims *)((*pvVar5 + (long)(&icount)[(int)(local_40 + local_254)] + 1) -
                          (long)local_260);
    }
    else {
      local_268 = (&icount)[(int)(local_40 + local_254)];
    }
    in_stack_fffffffffffffb68 = local_260;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_R9,
                        (long)(int)local_40);
    if ((pointer)*pvVar5 < in_stack_fffffffffffffb68) {
      local_3d0 = 1;
    }
    else {
      in_stack_fffffffffffffb60 = local_268;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_R9,
                          (long)(int)local_40);
      if ((Dims *)(*pvVar5 - (long)local_260) < in_stack_fffffffffffffb60) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_R9,
                            (long)(int)local_40);
        local_268 = (Dims *)(*pvVar5 - (long)local_260);
      }
    }
    if (2 < verbose) {
      printf("    j=%d, st=%lu ct=%lu\n",(ulong)local_40,local_260,local_268);
    }
    (&local_c8[0].first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start)[(int)local_40] = local_260;
    local_148[(int)local_40] = (ulong)local_268;
    local_250 = (long)local_268 * local_250;
    if (1 < verbose) {
      printf("    s[%d]=%lu, c[%d]=%lu, n=%lu\n",(ulong)local_40,
             (&local_c8[0].first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start)[(int)local_40],(ulong)local_40,
             local_148[(int)local_40],local_250);
    }
  }
  if (1 < verbose) {
    printf(" total size of data to read = %lu\n",local_250 * (long)local_3b0);
  }
  this = local_c8;
  __x = local_20;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_R9,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(iVar8,in_stack_fffffffffffffb78));
  print_slice_info(in_R9,SUB41((uint)iVar8 >> 0x18,0),in_stack_fffffffffffffb70,
                   in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb40);
  if (local_3d0 == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_3b0;
    local_290 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xa00000)) / auVar1,0);
    if (local_250 < local_290) {
      local_290 = local_250;
    }
    if (1 < verbose) {
      printf("Read size strategy:\n");
    }
    local_288 = 1;
    local_298 = 1;
    for (local_3c = local_3c8 - 1; -1 < (int)local_3c; local_3c = local_3c - 1) {
      if (local_288 < local_290) {
        auStack_318[(int)local_3c] = local_290 / (ulong)(long)(int)local_288;
        if (local_148[(int)local_3c] < auStack_318[(int)local_3c]) {
          auStack_318[(int)local_3c] = local_148[(int)local_3c];
        }
      }
      else {
        auStack_318[(int)local_3c] = 1;
      }
      if (1 < verbose) {
        printf("    dim %d: read %lu elements\n",(ulong)local_3c,auStack_318[(int)local_3c]);
      }
      local_288 = local_288 * local_148[(int)local_3c];
      local_298 = local_298 * auStack_318[(int)local_3c];
    }
    if (1 < verbose) {
      printf("    read %lu elements at once, %lu in total (nelems=%lu)\n",local_298,local_288,
             local_250);
    }
    for (local_40 = 0; (int)local_40 < local_3c8; local_40 = local_40 + 1) {
      local_1c8[(int)local_40] =
           (long)(&local_c8[0].first.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start)[(int)local_40];
      local_248[(int)local_40] = auStack_318[(int)local_40];
      iVar8 = ndigits(0x16b878);
      *(int *)(&stack0xfffffffffffffc58 + (long)(int)local_40 * 4) = iVar8;
    }
    local_288 = 0;
    while (local_288 < local_250) {
      local_298 = 1;
      for (local_40 = 0; (int)local_40 < local_3c8; local_40 = local_40 + 1) {
        local_298 = local_248[(int)local_40] * local_298;
      }
      local_3f0 = local_1c8[local_3c8 + -1];
      local_3f8 = local_248[local_3c8 + -1];
      for (local_3c = local_3c8 - 2; -1 < (int)local_3c; local_3c = local_3c - 1) {
        local_3f0 = local_1c8[(int)local_3c] * local_3f8 + local_3f0;
        local_3f8 = local_248[(int)local_3c] * local_3f8;
      }
      if (2 < verbose) {
        uVar6 = std::__cxx11::string::c_str();
        printf("adios_read_var name=%s ",uVar6);
        printf("%s = { ","  start");
        for (local_40 = 0; (int)local_40 < local_3c8; local_40 = local_40 + 1) {
          printf("%lu ",local_1c8[(int)local_40]);
        }
        printf("}");
        printf("%s = { ","  count");
        for (local_40 = 0; (int)local_40 < local_3c8; local_40 = local_40 + 1) {
          printf("%lu ",local_248[(int)local_40]);
        }
        printf("}");
        printf("  read %lu elems\n",local_298);
      }
      if (1 < verbose) {
        printf("    read block %zu from offset %lu nelems %lu)\n",local_30,local_3f0,local_298);
      }
      adios2::helper::Uint64ArrayToSizetVector((ulong)&local_410,(ulong *)(long)local_3c8);
      adios2::helper::Uint64ArrayToSizetVector((ulong)local_428,(ulong *)(long)local_3c8);
      if (*(int *)&local_20[1].first.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage == 2) {
        for (local_40 = 0; (int)local_40 < local_3c8; local_40 = local_40 + 1) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_stack_00000008,(long)(int)local_40);
          in_stack_fffffffffffffb40 =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)*pvVar5;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_410,(long)(int)local_40);
          *pvVar5 = (long)&(in_stack_fffffffffffffb40->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + *pvVar5;
        }
      }
      if (2 < verbose) {
        printf("set selection: ");
        printf("%s = { ","  start");
        for (local_40 = 0; (int)local_40 < local_3c8; local_40 = local_40 + 1) {
          puVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16bc46);
          printf("%zu ",puVar7[(int)local_40]);
        }
        printf("}");
        printf("%s = { ","  count");
        for (local_40 = 0; (int)local_40 < local_3c8; local_40 = local_40 + 1) {
          puVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16bcdf);
          printf("%zu ",puVar7[(int)local_40]);
        }
        printf("}");
        printf("\n");
      }
      if (((ulong)local_20[1].second.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish & 0x100000000) == 0) {
        if (*(int *)&local_20[1].first.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == 5) {
          adios2::core::VariableBase::SetBlockSelection((ulong)local_20);
        }
        ppVar3 = local_20;
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                  (this,&__x->first,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffb40);
        adios2::core::VariableBase::SetSelection((pair *)ppVar3);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(in_stack_fffffffffffffb30);
      }
      if (1 < local_3b4) {
        if (2 < verbose) {
          printf("set Step selection: from %lu read %lu steps\n",local_1c8[0],local_248[0]);
        }
        local_46c = 1;
        in_stack_fffffffffffffb30 = local_20;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_int,_true>
                  (local_468,(unsigned_long *)&local_28,&local_46c);
        adios2::core::VariableBase::SetStepSelection((pair *)in_stack_fffffffffffffb30);
      }
      adios2::core::Variable<std::__cxx11::string>::SelectionSize();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this,(size_type)__x);
      adios2::core::Engine::Get<std::__cxx11::string>(local_10,(vector *)local_20,(Mode)local_280);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::data((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16bead);
      print_dataset(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70,
                    in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,in_stack_fffffffffffffc58);
      local_288 = local_298 + local_288;
      bVar2 = true;
      for (local_40 = local_3c8 - 1; -1 < (int)local_40; local_40 = local_40 - 1) {
        if (bVar2) {
          if (local_1c8[(int)local_40] + local_248[(int)local_40] ==
              (long)(&local_c8[0].first.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start)[(int)local_40] + local_148[(int)local_40]) {
            local_1c8[(int)local_40] =
                 (long)(&local_c8[0].first.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start)[(int)local_40];
            local_248[(int)local_40] = auStack_318[(int)local_40];
            bVar2 = true;
          }
          else {
            local_1c8[(int)local_40] = auStack_318[(int)local_40] + local_1c8[(int)local_40];
            if ((long)(&local_c8[0].first.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start)[(int)local_40] + local_148[(int)local_40]
                < local_1c8[(int)local_40] + local_248[(int)local_40]) {
              local_248[(int)local_40] =
                   (long)(&local_c8[0].first.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start)[(int)local_40] +
                   (local_148[(int)local_40] - local_1c8[(int)local_40]);
            }
            bVar2 = false;
          }
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb40)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb40)
      ;
    }
    print_endline();
  }
LAB_0016c0e4:
  local_4 = 0;
  local_3cc = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffb40);
  return local_4;
}

Assistant:

int readVarBlock(core::Engine *fp, core::IO *io, core::Variable<T> *variable, size_t step,
                 size_t blockid, Dims Count, Dims Start)
{
    int i, j;
    uint64_t start_t[MAX_DIMS],
        count_t[MAX_DIMS]; // processed <0 values in start/count
    uint64_t s[MAX_DIMS],
        c[MAX_DIMS]; // for block reading of smaller chunks
    uint64_t nelems; // number of elements to read
    int tidx;
    uint64_t st, ct;
    std::vector<T> dataV;
    uint64_t sum;             // working var to sum up things
    uint64_t maxreadn;        // max number of elements to read once up to a limit
                              // (10MB of data)
    uint64_t actualreadn;     // our decision how much to read at once
    uint64_t readn[MAX_DIMS]; // how big chunk to read in in each dimension?
    bool incdim;              // used in incremental reading in
    int ndigits_dims[32];     // # of digits (to print) of each dimension

    const size_t elemsize = variable->m_ElementSize;
    const int nsteps = (timestep ? 1 : static_cast<int>(variable->GetAvailableStepsCount()));
    const int ndim = static_cast<int>(variable->m_Count.size());
    // create the counter arrays with the appropriate lengths
    // transfer start and count arrays to format dependent arrays

    nelems = 1;
    tidx = 0;

    if (nsteps > 1)
    {
        if (istart[0] < 0) // negative index means last-|index|
            st = nsteps + istart[0];
        else
            st = istart[0];
        if (icount[0] < 0) // negative index means last-|index|+1-start
            ct = nsteps + icount[0] + 1 - st;
        else
            ct = icount[0];

        if (verbose > 2)
            printf("    time: st=%" PRIu64 " ct=%" PRIu64 "\n", st, ct);

        // check if this block falls into the requested time
        if (step < st || step >= st + ct)
            return 0;
        tidx = 1;
    }

    int out_of_bound = 0;
    for (j = 0; j < ndim; j++)
    {
        if (istart[j + tidx] < 0) // negative index means last-|index|
            st = Count[j] + istart[j + tidx];
        else
            st = istart[j + tidx];
        if (icount[j + tidx] < 0) // negative index means last-|index|+1-start
            ct = Count[j] + icount[j + tidx] + 1 - st;
        else
            ct = icount[j + tidx];

        if (st > Count[j])
        {
            out_of_bound = 1;
        }
        else if (ct > Count[j] - st)
        {
            ct = Count[j] - st;
        }
        if (verbose > 2)
            printf("    j=%d, st=%" PRIu64 " ct=%" PRIu64 "\n", j, st, ct);

        start_t[j] = st;
        count_t[j] = ct;
        nelems *= ct;
        if (verbose > 1)
            printf("    s[%d]=%" PRIu64 ", c[%d]=%" PRIu64 ", n=%" PRIu64 "\n", j, start_t[j], j,
                   count_t[j], nelems);
    }

    if (verbose > 1)
    {
        printf(" total size of data to read = %" PRIu64 "\n", nelems * elemsize);
    }

    print_slice_info(variable, false, start_t, count_t, Count);

    if (out_of_bound)
        return 0;

    maxreadn = MAX_BUFFERSIZE / elemsize;
    if (nelems < maxreadn)
        maxreadn = nelems;

    // allocate data array
    // data = (void *)malloc(maxreadn * elemsize + 8); // +8 for just to be
    // sure

    // determine strategy how to read in:
    //  - at once
    //  - loop over 1st dimension
    //  - loop over 1st & 2nd dimension
    //  - etc
    if (verbose > 1)
        printf("Read size strategy:\n");
    sum = (uint64_t)1;
    actualreadn = (uint64_t)1;
    for (i = ndim - 1; i >= 0; i--)
    {
        if (sum >= (uint64_t)maxreadn)
        {
            readn[i] = 1;
        }
        else
        {
            readn[i] = maxreadn / (int)sum; // sum is small for 4 bytes here
            // this may be over the max count for this dimension
            if (readn[i] > count_t[i])
                readn[i] = count_t[i];
        }
        if (verbose > 1)
            printf("    dim %d: read %" PRIu64 " elements\n", i, readn[i]);
        sum = sum * (uint64_t)count_t[i];
        actualreadn = actualreadn * readn[i];
    }
    if (verbose > 1)
        printf("    read %" PRIu64 " elements at once, %" PRIu64 " in total (nelems=%" PRIu64 ")\n",
               actualreadn, sum, nelems);

    // init s and c
    // and calculate ndigits_dims
    for (j = 0; j < ndim; j++)
    {
        s[j] = start_t[j];
        c[j] = readn[j];

        ndigits_dims[j] =
            ndigits(start_t[j] + count_t[j] - 1); // -1: dim=100 results in 2 digits (0..99)
    }

    // read until read all 'nelems' elements
    sum = 0;
    while (sum < nelems)
    {

        // how many elements do we read in next?
        actualreadn = 1;
        for (j = 0; j < ndim; j++)
            actualreadn *= c[j];

        uint64_t startoffset = s[ndim - 1];
        uint64_t tmpprod = c[ndim - 1];
        for (i = ndim - 2; i >= 0; i--)
        {
            startoffset += s[i] * tmpprod;
            tmpprod *= c[i];
        }

        if (verbose > 2)
        {
            printf("adios_read_var name=%s ", variable->m_Name.c_str());
            PRINT_DIMS_UINT64("  start", s, ndim, j);
            PRINT_DIMS_UINT64("  count", c, ndim, j);
            printf("  read %" PRIu64 " elems\n", actualreadn);
        }
        if (verbose > 1)
            printf("    read block %zu from offset %" PRIu64 " nelems %" PRIu64 ")\n", blockid,
                   startoffset, actualreadn);

        // read a slice finally
        Dims startv = helper::Uint64ArrayToSizetVector(ndim, s);
        Dims countv = helper::Uint64ArrayToSizetVector(ndim, c);

        /* In current implementation we read with global selection, so
         * we need to adjust start_t for global offsets here.
         * TODO: this will change in the future to block reading with
         * relative
         * selection
         */
        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            for (j = 0; j < ndim; j++)
            {
                startv[j] += Start[j];
            }
        }

        if (verbose > 2)
        {
            printf("set selection: ");
            PRINT_DIMS_SIZET("  start", startv.data(), ndim, j);
            PRINT_DIMS_SIZET("  count", countv.data(), ndim, j);
            printf("\n");
        }

        if (!variable->m_SingleValue)
        {
            if (variable->m_ShapeID == ShapeID::LocalArray)
            {
                variable->SetBlockSelection(blockid);
            }
            variable->SetSelection({startv, countv});
        }

        if (nsteps > 1)
        {
            if (verbose > 2)
            {
                printf("set Step selection: from %" PRIu64 " read %" PRIu64 " steps\n", s[0], c[0]);
            }
            variable->SetStepSelection({step, 1});
        }

        dataV.resize(variable->SelectionSize());
        fp->Get(*variable, dataV, adios2::Mode::Sync);
        // print slice
        print_dataset(dataV.data(), variable->m_Type, s, c, ndim, ndigits_dims);

        // prepare for next read
        sum += actualreadn;
        incdim = true; // largest dim should be increased
        for (j = ndim - 1; j >= 0; j--)
        {
            if (incdim)
            {
                if (s[j] + c[j] == start_t[j] + count_t[j])
                {
                    // reached the end of this dimension
                    s[j] = start_t[j];
                    c[j] = readn[j];
                    incdim = true; // next smaller dim can increase too
                }
                else
                {
                    // move up in this dimension up to total count
                    s[j] += readn[j];
                    if (s[j] + c[j] > start_t[j] + count_t[j])
                    {
                        // do not reach over the limit
                        c[j] = start_t[j] + count_t[j] - s[j];
                    }
                    incdim = false;
                }
            }
        }
    } // end while sum < nelems
    print_endline();
    return 0;
}